

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::RenderTextClippedEx
               (ImDrawList *draw_list,ImVec2 *pos_min,ImVec2 *pos_max,char *text,
               char *text_display_end,ImVec2 *text_size_if_known,ImVec2 *align,ImRect *clip_rect)

{
  ImVec2 IVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  ImVec2 *pIVar6;
  ImU32 col;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 auVar11 [16];
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_68;
  ImDrawList *local_60;
  undefined1 local_58 [16];
  ImVec2 local_40;
  float local_38;
  float local_34;
  undefined1 extraout_var [56];
  
  IVar1 = *pos_min;
  local_68 = IVar1;
  local_60 = draw_list;
  if (text_size_if_known == (ImVec2 *)0x0) {
    local_58 = ZEXT416((uint)IVar1.x);
    auVar9._0_8_ = CalcTextSize(text,text_display_end,false,0.0);
    auVar9._8_56_ = extraout_var;
    auVar8 = auVar9._0_16_;
    auVar11 = local_58;
  }
  else {
    auVar8._8_8_ = 0;
    auVar8._0_4_ = text_size_if_known->x;
    auVar8._4_4_ = text_size_if_known->y;
    auVar11 = ZEXT416((uint)IVar1.x);
  }
  fVar10 = auVar11._0_4_;
  fVar7 = IVar1.y;
  bVar2 = true;
  pIVar6 = pos_max;
  if (clip_rect != (ImRect *)0x0) {
    pos_min = &clip_rect->Min;
    pIVar6 = &clip_rect->Max;
  }
  auVar3 = vmovshdup_avx(auVar8);
  if (auVar8._0_4_ + fVar10 < pIVar6->x) {
    bVar2 = pIVar6->y <= auVar3._0_4_ + fVar7;
  }
  if (clip_rect != (ImRect *)0x0) {
    bVar5 = true;
    if ((clip_rect->Min).x <= fVar10) {
      bVar5 = fVar7 < (clip_rect->Min).y;
    }
    bVar2 = (bool)(bVar2 | bVar5);
  }
  if (0.0 < align->x) {
    auVar8 = vfmadd213ss_fma(ZEXT416((uint)align->x),
                             ZEXT416((uint)((pos_max->x - fVar10) - auVar8._0_4_)),auVar11);
    uVar4 = vcmpss_avx512f(auVar8,auVar11,2);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_68.x = (float)((uint)bVar5 * (int)fVar10 + (uint)!bVar5 * auVar8._0_4_);
  }
  if (0.0 < align->y) {
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)align->y),
                              ZEXT416((uint)((pos_max->y - fVar7) - auVar3._0_4_)),
                              ZEXT416((uint)fVar7));
    uVar4 = vcmpss_avx512f(auVar11,ZEXT416((uint)fVar7),2);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_68.y = (float)((uint)bVar5 * (int)fVar7 + (uint)!bVar5 * auVar11._0_4_);
  }
  if (bVar2) {
    local_34 = pIVar6->y;
    local_40 = ((ImRect *)pos_min)->Min;
    cpu_fine_clip_rect = (ImVec4 *)&local_40;
    local_38 = pIVar6->x;
    col = GetColorU32(0,1.0);
  }
  else {
    col = GetColorU32(0,1.0);
    cpu_fine_clip_rect = (ImVec4 *)0x0;
  }
  ImDrawList::AddText(local_60,(ImFont *)0x0,0.0,&local_68,col,text,text_display_end,0.0,
                      cpu_fine_clip_rect);
  return;
}

Assistant:

void ImGui::RenderTextClippedEx(ImDrawList* draw_list, const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_display_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        draw_list->AddText(NULL, 0.0f, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
}